

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalForcesContIntDamping
          (ChElementBeamANCF_3243 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_1,__1,__1> *a_lhs;
  double *pdVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 (*pauVar5) [32];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  void *pvVar47;
  undefined8 *puVar48;
  double *pdVar49;
  ulong uVar50;
  char *pcVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  double dVar89;
  double dVar90;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  undefined1 auVar91 [32];
  double dVar98;
  double dVar100;
  double dVar101;
  undefined1 auVar99 [32];
  double dVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  double dVar108;
  double dVar111;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  double local_17e0;
  undefined1 local_16c0 [16];
  double dStack_16b0;
  double dStack_16a8;
  double local_16a0;
  double local_1680;
  double local_1660;
  Scalar local_1608;
  double local_1600;
  double dStack_15f8;
  double dStack_15f0;
  double dStack_15e8;
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [16];
  double dStack_15b0;
  double dStack_15a8;
  double local_15a0;
  double dStack_1598;
  double dStack_1590;
  double dStack_1588;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  double local_1520;
  double dStack_1518;
  double dStack_1510;
  double dStack_1508;
  double local_1500;
  double dStack_14f8;
  double dStack_14f0;
  double dStack_14e8;
  double local_14e0;
  double dStack_14d8;
  double dStack_14d0;
  double dStack_14c8;
  double local_14c0;
  double dStack_14b8;
  double dStack_14b0;
  double dStack_14a8;
  double local_14a0;
  double dStack_1498;
  double dStack_1490;
  double dStack_1488;
  double local_1480;
  double dStack_1478;
  double dStack_1470;
  double dStack_1468;
  double local_1460;
  double dStack_1458;
  double dStack_1450;
  double dStack_1448;
  double local_1440;
  double dStack_1438;
  double dStack_1430;
  double dStack_1428;
  double local_1420;
  double dStack_1418;
  double dStack_1410;
  double dStack_1408;
  double local_1400;
  double dStack_13f8;
  double dStack_13f0;
  double dStack_13e8;
  double local_13e0;
  double dStack_13d8;
  double dStack_13d0;
  double dStack_13c8;
  double local_13c0;
  double dStack_13b8;
  double dStack_13b0;
  double dStack_13a8;
  double local_13a0;
  double dStack_1398;
  double dStack_1390;
  double dStack_1388;
  double local_1380;
  double dStack_1378;
  double dStack_1370;
  double dStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  double local_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double local_1240;
  double dStack_1238;
  double dStack_1230;
  double dStack_1228;
  double local_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double local_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double dStack_11c8;
  double local_11c0;
  double dStack_11b8;
  double dStack_11b0;
  double dStack_11a8;
  double local_11a0;
  double dStack_1198;
  double dStack_1190;
  double dStack_1188;
  double local_1180;
  double dStack_1178;
  double dStack_1170;
  double dStack_1168;
  double local_1160;
  double dStack_1158;
  double dStack_1150;
  double dStack_1148;
  double local_1140;
  double dStack_1138;
  double dStack_1130;
  double dStack_1128;
  double local_1120;
  double dStack_1118;
  double dStack_1110;
  double dStack_1108;
  double local_1100;
  double dStack_10f8;
  double dStack_10f0;
  double dStack_10e8;
  double local_10e0;
  double dStack_10d8;
  double dStack_10d0;
  double dStack_10c8;
  double local_10c0;
  double dStack_10b8;
  double dStack_10b0;
  double dStack_10a8;
  double local_10a0;
  double dStack_1098;
  double dStack_1090;
  double dStack_1088;
  double local_1080;
  double dStack_1078;
  double dStack_1070;
  double dStack_1068;
  double local_1060;
  double dStack_1058;
  double dStack_1050;
  double dStack_1048;
  double local_1040;
  double dStack_1038;
  double dStack_1030;
  double dStack_1028;
  double local_1020;
  double dStack_1018;
  double dStack_1010;
  double dStack_1008;
  double local_1000;
  double dStack_ff8;
  double dStack_ff0;
  double dStack_fe8;
  double local_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double dStack_fb0;
  double dStack_fa8;
  double local_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  undefined1 local_f70 [160];
  double local_ed0;
  double dStack_ec8;
  double dStack_ec0;
  double dStack_eb8;
  undefined1 local_eb0 [32];
  undefined1 local_e90 [32];
  undefined1 local_e70 [32];
  double local_e50;
  double dStack_e48;
  double local_e40;
  double local_e38;
  double dStack_e30;
  double local_e28;
  double local_e20;
  double dStack_e18;
  double local_e10;
  double local_e08;
  double dStack_e00;
  double dStack_df8;
  double dStack_df0;
  double local_de8;
  double dStack_de0;
  double dStack_dd8;
  double dStack_dd0;
  double local_dc8;
  double dStack_dc0;
  double dStack_db8;
  double dStack_db0;
  double local_da8;
  double dStack_da0;
  double dStack_d98;
  double dStack_d90;
  double local_d88;
  double dStack_d80;
  double dStack_d78;
  double dStack_d70;
  double local_d68;
  double dStack_d60;
  double dStack_d58;
  double dStack_d50;
  undefined1 local_d48 [32];
  undefined1 local_d28 [32];
  undefined1 local_d08 [32];
  double local_ce8;
  double dStack_ce0;
  double local_cd8;
  double local_cd0;
  double dStack_cc8;
  double local_cc0;
  double local_cb8;
  double dStack_cb0;
  double local_ca8;
  double local_ca0;
  double dStack_c98;
  double dStack_c90;
  double dStack_c88;
  double local_c80;
  double dStack_c78;
  double dStack_c70;
  double dStack_c68;
  double local_c60;
  double dStack_c58;
  double dStack_c50;
  double dStack_c48;
  double local_c40;
  double dStack_c38;
  double dStack_c30;
  double dStack_c28;
  undefined1 local_c20 [32];
  double local_c00;
  double dStack_bf8;
  double dStack_bf0;
  double dStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  double local_b80;
  double dStack_b78;
  double local_b70;
  double local_b68;
  double dStack_b60;
  double local_b58;
  double local_b50;
  double dStack_b48;
  double local_b40;
  double local_b38;
  double dStack_b30;
  double dStack_b28;
  double dStack_b20;
  double local_b18;
  double dStack_b10;
  double dStack_b08;
  double dStack_b00;
  double local_af8;
  double dStack_af0;
  double dStack_ae8;
  double dStack_ae0;
  double local_ad8;
  double dStack_ad0;
  double dStack_ac8;
  double dStack_ac0;
  double local_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double local_a98;
  double dStack_a90;
  double dStack_a88;
  double dStack_a80;
  undefined1 local_a78 [32];
  undefined1 local_a58 [32];
  undefined1 local_a38 [32];
  double local_a18;
  double dStack_a10;
  double local_a08;
  double local_a00;
  double dStack_9f8;
  double local_9f0;
  double local_9e8;
  double dStack_9e0;
  double local_9d8;
  double local_9d0;
  double dStack_9c8;
  double dStack_9c0;
  double dStack_9b8;
  double local_9b0;
  double dStack_9a8;
  double dStack_9a0;
  double dStack_998;
  double local_990;
  double dStack_988;
  double dStack_980;
  double dStack_978;
  double local_970;
  double dStack_968;
  double dStack_960;
  double dStack_958;
  double local_950;
  double dStack_948;
  double dStack_940;
  double dStack_938;
  double local_930;
  double dStack_928;
  double dStack_920;
  double dStack_918;
  double local_910;
  double dStack_908;
  double dStack_900;
  double dStack_8f8;
  undefined1 local_8f0 [32];
  undefined1 local_8d0 [32];
  double local_8b0;
  double dStack_8a8;
  double local_8a0;
  double local_898;
  double dStack_890;
  double local_888;
  double local_880;
  double dStack_878;
  double local_870;
  double local_868;
  double dStack_860;
  double dStack_858;
  double dStack_850;
  double local_848;
  double dStack_840;
  double dStack_838;
  double dStack_830;
  double local_828;
  double dStack_820;
  double dStack_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  double dStack_7f8;
  double dStack_7f0;
  double local_7e8;
  double dStack_7e0;
  double dStack_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  double dStack_7b8;
  double dStack_7b0;
  undefined1 local_7a8 [32];
  undefined1 local_788 [32];
  undefined1 local_768 [32];
  double local_748;
  double dStack_740;
  double local_738;
  double local_730;
  double dStack_728;
  double local_720;
  double local_718;
  double dStack_710;
  double local_708;
  Matrix<double,_45,_3,_0,_45,_3> local_6f8;
  Matrix<double,_8,_3,_1,_8,_3> local_2c0;
  MatrixNx6 local_200;
  
  CalcCombinedCoordMatrix(this,&local_200);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 8) {
    pcVar51 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 8, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 8, 6, 1>, Option = 0]"
    ;
LAB_0072413c:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar51);
  }
  a_lhs = &this->m_SD;
  local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)a_lhs;
  local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[1]
       = (double)&local_200;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      == 0x2d) {
    memset((Matrix<double,_45,_6,_0,_45,_6> *)local_f70,0,0x870);
    local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0]
         = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,8,6,1,8,6>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,45,6,0,45,6>>
              ((Matrix<double,_45,_6,_0,_45,_6> *)local_f70,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_6f8,&local_200,
               (Scalar *)&local_2c0);
    peVar3 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_rows == 0xc) &&
       ((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols == 1)) {
      dVar2 = this->m_Alpha;
      pauVar5 = (undefined1 (*) [32])
                (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_10c0 = (double)local_f70._64_8_;
      dStack_10b8 = (double)local_f70._72_8_;
      dStack_10b0 = (double)local_f70._80_8_;
      dStack_10a8 = (double)local_f70._88_8_;
      local_10e0 = local_c60;
      dStack_10d8 = dStack_c58;
      dStack_10d0 = dStack_c50;
      dStack_10c8 = dStack_c48;
      auVar126._8_8_ = 0xbff0000000000000;
      auVar126._0_8_ = 0xbff0000000000000;
      auVar126._16_8_ = 0xbff0000000000000;
      auVar126._24_8_ = 0xbff0000000000000;
      dVar102 = dVar2 + dVar2;
      local_1120 = local_af8;
      dStack_1118 = dStack_af0;
      dStack_1110 = dStack_ae8;
      dStack_1108 = dStack_ae0;
      local_1100 = local_990;
      dStack_10f8 = dStack_988;
      dStack_10f0 = dStack_980;
      dStack_10e8 = dStack_978;
      local_1480 = local_de8;
      dStack_1478 = dStack_de0;
      dStack_1470 = dStack_dd8;
      dStack_1468 = dStack_dd0;
      local_1140 = local_c80;
      dStack_1138 = dStack_c78;
      dStack_1130 = dStack_c70;
      dStack_1128 = dStack_c68;
      local_1160 = local_b18;
      dStack_1158 = dStack_b10;
      dStack_1150 = dStack_b08;
      dStack_1148 = dStack_b00;
      local_1180 = local_9b0;
      dStack_1178 = dStack_9a8;
      dStack_1170 = dStack_9a0;
      dStack_1168 = dStack_998;
      local_11a0 = local_848;
      dStack_1198 = dStack_840;
      dStack_1190 = dStack_838;
      dStack_1188 = dStack_830;
      local_14a0 = (double)local_f70._0_8_;
      dStack_1498 = (double)local_f70._8_8_;
      dStack_1490 = (double)local_f70._16_8_;
      dStack_1488 = (double)local_f70._24_8_;
      local_14e0 = local_e08;
      dStack_14d8 = dStack_e00;
      dStack_14d0 = dStack_df8;
      dStack_14c8 = dStack_df0;
      local_11c0 = local_ca0;
      dStack_11b8 = dStack_c98;
      dStack_11b0 = dStack_c90;
      dStack_11a8 = dStack_c88;
      local_11e0 = local_b38;
      dStack_11d8 = dStack_b30;
      dStack_11d0 = dStack_b28;
      dStack_11c8 = dStack_b20;
      local_14c0 = local_9d0;
      dStack_14b8 = dStack_9c8;
      dStack_14b0 = dStack_9c0;
      dStack_14a8 = dStack_9b8;
      local_1200 = local_868;
      dStack_11f8 = dStack_860;
      dStack_11f0 = dStack_858;
      dStack_11e8 = dStack_850;
      auVar105._0_8_ =
           (double)local_f70._0_8_ * (double)local_f70._0_8_ + local_e08 * local_e08 +
           local_ca0 * local_ca0 + -1.0 +
           dVar102 * ((double)local_f70._0_8_ * local_b38 + local_e08 * local_9d0 +
                     local_ca0 * local_868);
      auVar105._8_8_ =
           (double)local_f70._8_8_ * (double)local_f70._8_8_ + dStack_e00 * dStack_e00 +
           dStack_c98 * dStack_c98 + -1.0 +
           dVar102 * ((double)local_f70._8_8_ * dStack_b30 + dStack_e00 * dStack_9c8 +
                     dStack_c98 * dStack_860);
      auVar105._16_8_ =
           (double)local_f70._16_8_ * (double)local_f70._16_8_ + dStack_df8 * dStack_df8 +
           dStack_c90 * dStack_c90 + -1.0 +
           dVar102 * ((double)local_f70._16_8_ * dStack_b28 + dStack_df8 * dStack_9c0 +
                     dStack_c90 * dStack_858);
      auVar105._24_8_ =
           (double)local_f70._24_8_ * (double)local_f70._24_8_ + dStack_df0 * dStack_df0 +
           dStack_c88 * dStack_c88 + -1.0 +
           dVar102 * ((double)local_f70._24_8_ * dStack_b20 + dStack_df0 * dStack_9b8 +
                     dStack_c88 * dStack_850);
      local_1360 = *pauVar5;
      local_1380 = *(double *)pauVar5[1];
      dStack_1378 = *(double *)(pauVar5[1] + 8);
      dStack_1370 = *(double *)(pauVar5[1] + 0x10);
      dStack_1368 = *(double *)(pauVar5[1] + 0x18);
      auVar88 = pauVar5[1];
      local_1600 = *(double *)pauVar5[2];
      dStack_15f8 = *(double *)(pauVar5[2] + 8);
      dStack_15f0 = *(double *)(pauVar5[2] + 0x10);
      dStack_15e8 = *(double *)(pauVar5[2] + 0x18);
      auVar59 = vmulpd_avx512vl(local_1360,auVar105);
      dStack_f88 = (peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[0] * 0.5;
      local_fe0 = auVar59._0_8_ * dStack_f88;
      dStack_fd8 = auVar59._8_8_ * dStack_f88;
      dStack_fd0 = auVar59._16_8_ * dStack_f88;
      dStack_fc8 = auVar59._24_8_ * dStack_f88;
      local_fc0 = ((double)local_f70._32_8_ * (double)local_f70._32_8_ + local_de8 * local_de8 +
                   local_c80 * local_c80 + -1.0 +
                  dVar102 * ((double)local_f70._32_8_ * local_b18 + local_de8 * local_9b0 +
                            local_c80 * local_848)) * local_1380 * dStack_f88;
      dStack_fb8 = ((double)local_f70._40_8_ * (double)local_f70._40_8_ + dStack_de0 * dStack_de0 +
                    dStack_c78 * dStack_c78 + -1.0 +
                   dVar102 * ((double)local_f70._40_8_ * dStack_b10 + dStack_de0 * dStack_9a8 +
                             dStack_c78 * dStack_840)) * dStack_1378 * dStack_f88;
      dStack_fb0 = ((double)local_f70._48_8_ * (double)local_f70._48_8_ + dStack_dd8 * dStack_dd8 +
                    dStack_c70 * dStack_c70 + -1.0 +
                   dVar102 * ((double)local_f70._48_8_ * dStack_b08 + dStack_dd8 * dStack_9a0 +
                             dStack_c70 * dStack_838)) * dStack_1370 * dStack_f88;
      dStack_fa8 = ((double)local_f70._56_8_ * (double)local_f70._56_8_ + dStack_dd0 * dStack_dd0 +
                    dStack_c68 * dStack_c68 + -1.0 +
                   dVar102 * ((double)local_f70._56_8_ * dStack_b00 + dStack_dd0 * dStack_998 +
                             dStack_c68 * dStack_830)) * dStack_1368 * dStack_f88;
      local_fa0 = ((double)local_f70._64_8_ * (double)local_f70._64_8_ + local_dc8 * local_dc8 +
                   local_c60 * local_c60 + -1.0 +
                  dVar102 * ((double)local_f70._64_8_ * local_af8 + local_dc8 * local_990 +
                            local_c60 * local_828)) * local_1600 * dStack_f88;
      dStack_f98 = ((double)local_f70._72_8_ * (double)local_f70._72_8_ + dStack_dc0 * dStack_dc0 +
                    dStack_c58 * dStack_c58 + -1.0 +
                   dVar102 * ((double)local_f70._72_8_ * dStack_af0 + dStack_dc0 * dStack_988 +
                             dStack_c58 * dStack_820)) * dStack_15f8 * dStack_f88;
      dStack_f90 = ((double)local_f70._80_8_ * (double)local_f70._80_8_ + dStack_db8 * dStack_db8 +
                    dStack_c50 * dStack_c50 + -1.0 +
                   dVar102 * ((double)local_f70._80_8_ * dStack_ae8 + dStack_db8 * dStack_980 +
                             dStack_c50 * dStack_818)) * dStack_15f0 * dStack_f88;
      dStack_f88 = ((double)local_f70._88_8_ * (double)local_f70._88_8_ + dStack_db0 * dStack_db0 +
                    dStack_c48 * dStack_c48 + -1.0 +
                   dVar102 * ((double)local_f70._88_8_ * dStack_ae0 + dStack_db0 * dStack_978 +
                             dStack_c48 * dStack_810)) * dStack_15e8 * dStack_f88;
      local_1500 = local_ad8;
      dStack_14f8 = dStack_ad0;
      dStack_14f0 = dStack_ac8;
      dStack_14e8 = dStack_ac0;
      local_13a0 = local_970;
      dStack_1398 = dStack_968;
      dStack_1390 = dStack_960;
      dStack_1388 = dStack_958;
      local_1400 = local_808;
      dStack_13f8 = dStack_800;
      dStack_13f0 = dStack_7f8;
      dStack_13e8 = dStack_7f0;
      local_15a0 = local_c40;
      dStack_1598 = dStack_c38;
      dStack_1590 = dStack_c30;
      dStack_1588 = dStack_c28;
      local_1460 = local_ab8;
      dStack_1458 = dStack_ab0;
      dStack_1450 = dStack_aa8;
      dStack_1448 = dStack_aa0;
      local_13c0 = local_950;
      dStack_13b8 = dStack_948;
      dStack_13b0 = dStack_940;
      dStack_13a8 = dStack_938;
      local_1420 = local_7e8;
      dStack_1418 = dStack_7e0;
      dStack_1410 = dStack_7d8;
      dStack_1408 = dStack_7d0;
      dVar89 = local_c20._0_8_;
      dVar92 = local_c20._8_8_;
      dVar94 = local_c20._16_8_;
      dVar96 = local_c20._24_8_;
      local_1580 = local_c20;
      local_13e0 = local_930;
      dStack_13d8 = dStack_928;
      dStack_13d0 = dStack_920;
      dStack_13c8 = dStack_918;
      local_1520 = local_d68;
      dStack_1518 = dStack_d60;
      dStack_1510 = dStack_d58;
      dStack_1508 = dStack_d50;
      local_1440 = local_7c8;
      dStack_1438 = dStack_7c0;
      dStack_1430 = dStack_7b8;
      dStack_1428 = dStack_7b0;
      auVar59 = vmulpd_avx512vl(local_f70._128_32_,local_f70._128_32_);
      auVar60 = vmulpd_avx512vl(local_c20,local_c20);
      auVar99._0_8_ =
           (double)local_f70._96_8_ * (double)local_f70._96_8_ + local_da8 * local_da8 +
           local_c40 * local_c40 + -1.0 +
           dVar102 * ((double)local_f70._96_8_ * local_ad8 + local_da8 * local_970 +
                     local_c40 * local_808);
      auVar99._8_8_ =
           (double)local_f70._104_8_ * (double)local_f70._104_8_ + dStack_da0 * dStack_da0 +
           dStack_c38 * dStack_c38 + -1.0 +
           dVar102 * ((double)local_f70._104_8_ * dStack_ad0 + dStack_da0 * dStack_968 +
                     dStack_c38 * dStack_800);
      auVar99._16_8_ =
           (double)local_f70._112_8_ * (double)local_f70._112_8_ + dStack_d98 * dStack_d98 +
           dStack_c30 * dStack_c30 + -1.0 +
           dVar102 * ((double)local_f70._112_8_ * dStack_ac8 + dStack_d98 * dStack_960 +
                     dStack_c30 * dStack_7f8);
      auVar99._24_8_ =
           (double)local_f70._120_8_ * (double)local_f70._120_8_ + dStack_d90 * dStack_d90 +
           dStack_c28 * dStack_c28 + -1.0 +
           dVar102 * ((double)local_f70._120_8_ * dStack_ac0 + dStack_d90 * dStack_958 +
                     dStack_c28 * dStack_7f0);
      auVar61 = vmulpd_avx512vl(local_1360,auVar99);
      auVar52._8_8_ = 0;
      auVar52._0_8_ =
           *(double *)
            ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 8);
      auVar52 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar52);
      dStack_fe8 = auVar52._0_8_;
      local_1060 = auVar61._0_8_ * dStack_fe8;
      dStack_1058 = auVar61._8_8_ * dStack_fe8;
      dStack_1050 = auVar61._16_8_ * dStack_fe8;
      dStack_1048 = auVar61._24_8_ * dStack_fe8;
      local_1020 = local_1380 *
                   (auVar59._0_8_ + local_d88 * local_d88 + auVar60._0_8_ + -1.0 +
                   dVar102 * (local_f70._128_8_ * local_ab8 + local_d88 * local_950 +
                             dVar89 * local_7e8)) * dStack_fe8;
      dStack_1018 = dStack_1378 *
                    (auVar59._8_8_ + dStack_d80 * dStack_d80 + auVar60._8_8_ + -1.0 +
                    dVar102 * (local_f70._136_8_ * dStack_ab0 + dStack_d80 * dStack_948 +
                              dVar92 * dStack_7e0)) * dStack_fe8;
      dStack_1010 = dStack_1370 *
                    (auVar59._16_8_ + dStack_d78 * dStack_d78 + auVar60._16_8_ + -1.0 +
                    dVar102 * (local_f70._144_8_ * dStack_aa8 + dStack_d78 * dStack_940 +
                              dVar94 * dStack_7d8)) * dStack_fe8;
      dStack_1008 = dStack_1368 *
                    (auVar59._24_8_ + dStack_d70 * dStack_d70 + auVar60._24_8_ + -1.0 +
                    dVar102 * (local_f70._152_8_ * dStack_aa0 + dStack_d70 * dStack_938 +
                              dVar96 * dStack_7d0)) * dStack_fe8;
      local_1000 = dStack_fe8 *
                   local_1600 *
                   (local_ed0 * local_ed0 + local_d68 * local_d68 + local_c00 * local_c00 + -1.0 +
                   dVar102 * (local_ed0 * local_a98 + local_d68 * local_930 + local_c00 * local_7c8)
                   );
      dStack_ff8 = dStack_fe8 *
                   dStack_15f8 *
                   (dStack_ec8 * dStack_ec8 + dStack_d60 * dStack_d60 + dStack_bf8 * dStack_bf8 +
                    -1.0 + dVar102 * (dStack_ec8 * dStack_a90 + dStack_d60 * dStack_928 +
                                     dStack_bf8 * dStack_7c0));
      dStack_ff0 = dStack_fe8 *
                   dStack_15f0 *
                   (dStack_ec0 * dStack_ec0 + dStack_d58 * dStack_d58 + dStack_bf0 * dStack_bf0 +
                    -1.0 + dVar102 * (dStack_ec0 * dStack_a88 + dStack_d58 * dStack_920 +
                                     dStack_bf0 * dStack_7b8));
      dStack_fe8 = dStack_fe8 *
                   dStack_15e8 *
                   (dStack_eb8 * dStack_eb8 + dStack_d50 * dStack_d50 + dStack_be8 * dStack_be8 +
                    -1.0 + dVar102 * (dStack_eb8 * dStack_a80 + dStack_d50 * dStack_918 +
                                     dStack_be8 * dStack_7b0));
      auVar59 = vmulpd_avx512vl(local_eb0,local_a78);
      dVar118 = local_be0._0_8_;
      dVar98 = local_be0._8_8_;
      dVar100 = local_be0._16_8_;
      dVar101 = local_be0._24_8_;
      local_1340 = local_7a8;
      auVar60 = vmulpd_avx512vl(local_e90,local_a58);
      dVar113 = local_d28._0_8_;
      dVar6 = local_d28._8_8_;
      dVar108 = local_d28._16_8_;
      dVar119 = local_d28._24_8_;
      dVar90 = local_bc0._0_8_;
      dVar93 = local_bc0._8_8_;
      dVar95 = local_bc0._16_8_;
      dVar97 = local_bc0._24_8_;
      local_1300 = local_788;
      auVar61 = vmulpd_avx512vl(local_e70,local_a38);
      auVar62 = vmulpd_avx512vl(local_d08,local_8d0);
      auVar61 = vaddpd_avx512vl(auVar61,auVar62);
      auVar62 = vmulpd_avx512vl(local_ba0,local_768);
      local_1320 = local_768;
      auVar61 = vaddpd_avx512vl(auVar61,auVar62);
      auVar62 = vmulpd_avx512vl(local_eb0,local_eb0);
      auVar63 = vmulpd_avx512vl(local_d48,local_d48);
      auVar62 = vaddpd_avx512vl(auVar62,auVar63);
      auVar63 = vmulpd_avx512vl(local_be0,local_be0);
      auVar62 = vaddpd_avx512vl(auVar62,auVar63);
      auVar63 = vmulpd_avx512vl(local_e90,local_e90);
      auVar64 = vmulpd_avx512vl(local_d28,local_d28);
      auVar63 = vaddpd_avx512vl(auVar63,auVar64);
      auVar64 = vmulpd_avx512vl(local_bc0,local_bc0);
      auVar63 = vaddpd_avx512vl(auVar63,auVar64);
      auVar64 = vmulpd_avx512vl(local_e70,local_e70);
      auVar65 = vmulpd_avx512vl(local_d08,local_d08);
      auVar64 = vaddpd_avx512vl(auVar64,auVar65);
      auVar65 = vmulpd_avx512vl(local_ba0,local_ba0);
      auVar64 = vaddpd_avx512vl(auVar64,auVar65);
      auVar62 = vaddpd_avx512vl(auVar62,auVar126);
      auVar63 = vaddpd_avx512vl(auVar63,auVar126);
      auVar64 = vaddpd_avx512vl(auVar64,auVar126);
      auVar121._0_8_ =
           dVar102 * (auVar59._0_8_ + local_d48._0_8_ * local_910 + dVar118 * local_7a8._0_8_);
      auVar121._8_8_ =
           dVar102 * (auVar59._8_8_ + local_d48._8_8_ * dStack_908 + dVar98 * local_7a8._8_8_);
      auVar121._16_8_ =
           dVar102 * (auVar59._16_8_ + local_d48._16_8_ * dStack_900 + dVar100 * local_7a8._16_8_);
      auVar121._24_8_ =
           dVar102 * (auVar59._24_8_ + local_d48._24_8_ * dStack_8f8 + dVar101 * local_7a8._24_8_);
      auVar59 = vaddpd_avx512vl(auVar62,auVar121);
      auVar124._0_8_ =
           dVar102 * (auVar60._0_8_ + local_8f0._0_8_ * dVar113 + dVar90 * local_788._0_8_);
      auVar124._8_8_ =
           dVar102 * (auVar60._8_8_ + local_8f0._8_8_ * dVar6 + dVar93 * local_788._8_8_);
      auVar124._16_8_ =
           dVar102 * (auVar60._16_8_ + local_8f0._16_8_ * dVar108 + dVar95 * local_788._16_8_);
      auVar124._24_8_ =
           dVar102 * (auVar60._24_8_ + local_8f0._24_8_ * dVar119 + dVar97 * local_788._24_8_);
      auVar60 = vaddpd_avx512vl(auVar63,auVar124);
      auVar59 = vmulpd_avx512vl(local_1360,auVar59);
      dStack_1028 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x10) * 0.5;
      local_10a0 = auVar59._0_8_ * dStack_1028;
      dStack_1098 = auVar59._8_8_ * dStack_1028;
      dStack_1090 = auVar59._16_8_ * dStack_1028;
      dStack_1088 = auVar59._24_8_ * dStack_1028;
      local_1080 = local_1380 * auVar60._0_8_ * dStack_1028;
      dStack_1078 = dStack_1378 * auVar60._8_8_ * dStack_1028;
      dStack_1070 = dStack_1370 * auVar60._16_8_ * dStack_1028;
      dStack_1068 = dStack_1368 * auVar60._24_8_ * dStack_1028;
      local_1040 = dStack_1028 * local_1600 * (auVar64._0_8_ + dVar102 * auVar61._0_8_);
      dStack_1038 = dStack_1028 * dStack_15f8 * (auVar64._8_8_ + dVar102 * auVar61._8_8_);
      dStack_1030 = dStack_1028 * dStack_15f0 * (auVar64._16_8_ + dVar102 * auVar61._16_8_);
      dStack_1028 = dStack_1028 * dStack_15e8 * (auVar64._24_8_ + dVar102 * auVar61._24_8_);
      dVar112 = local_eb0._0_8_;
      dVar114 = local_eb0._8_8_;
      dVar116 = local_eb0._16_8_;
      dVar117 = local_eb0._24_8_;
      auVar24._8_8_ = dStack_968;
      auVar24._0_8_ = local_970;
      auVar24._16_8_ = dStack_960;
      auVar24._24_8_ = dStack_958;
      auVar60 = vmulpd_avx512vl(local_d48,auVar24);
      auVar61._8_8_ = local_f70._104_8_;
      auVar61._0_8_ = local_f70._96_8_;
      auVar61._16_8_ = local_f70._112_8_;
      auVar61._24_8_ = local_f70._120_8_;
      auVar61 = vmulpd_avx512vl(auVar61,local_a78);
      auVar64._8_8_ = dStack_da0;
      auVar64._0_8_ = local_da8;
      auVar64._16_8_ = dStack_d98;
      auVar64._24_8_ = dStack_d90;
      auVar59._8_8_ = dStack_908;
      auVar59._0_8_ = local_910;
      auVar59._16_8_ = dStack_900;
      auVar59._24_8_ = dStack_8f8;
      auVar62 = vmulpd_avx512vl(auVar64,auVar59);
      auVar81._8_8_ = dStack_c38;
      auVar81._0_8_ = local_c40;
      auVar81._16_8_ = dStack_c30;
      auVar81._24_8_ = dStack_c28;
      auVar63 = vmulpd_avx512vl(auVar81,local_7a8);
      auVar14._8_8_ = dStack_ab0;
      auVar14._0_8_ = local_ab8;
      auVar14._16_8_ = dStack_aa8;
      auVar14._24_8_ = dStack_aa0;
      auVar65 = vmulpd_avx512vl(local_e90,auVar14);
      auVar22._8_8_ = dStack_948;
      auVar22._0_8_ = local_950;
      auVar22._16_8_ = dStack_940;
      auVar22._24_8_ = dStack_938;
      auVar66 = vmulpd_avx512vl(local_d28,auVar22);
      auVar18._8_8_ = dStack_7e0;
      auVar18._0_8_ = local_7e8;
      auVar18._16_8_ = dStack_7d8;
      auVar18._24_8_ = dStack_7d0;
      auVar67 = vmulpd_avx512vl(local_bc0,auVar18);
      auVar68 = vmulpd_avx512vl(local_f70._128_32_,local_a58);
      auVar78._8_8_ = dStack_d80;
      auVar78._0_8_ = local_d88;
      auVar78._16_8_ = dStack_d78;
      auVar78._24_8_ = dStack_d70;
      auVar69 = vmulpd_avx512vl(auVar78,local_8f0);
      auVar70 = vmulpd_avx512vl(local_c20,local_788);
      auVar73._8_8_ = dStack_a90;
      auVar73._0_8_ = local_a98;
      auVar73._16_8_ = dStack_a88;
      auVar73._24_8_ = dStack_a80;
      auVar71 = vmulpd_avx512vl(local_e70,auVar73);
      auVar20._8_8_ = dStack_928;
      auVar20._0_8_ = local_930;
      auVar20._16_8_ = dStack_920;
      auVar20._24_8_ = dStack_918;
      auVar72 = vmulpd_avx512vl(local_d08,auVar20);
      auVar16._8_8_ = dStack_7c0;
      auVar16._0_8_ = local_7c8;
      auVar16._16_8_ = dStack_7b8;
      auVar16._24_8_ = dStack_7b0;
      auVar73 = vmulpd_avx512vl(local_ba0,auVar16);
      auVar79._8_8_ = dStack_ec8;
      auVar79._0_8_ = local_ed0;
      auVar79._16_8_ = dStack_ec0;
      auVar79._24_8_ = dStack_eb8;
      auVar74 = vmulpd_avx512vl(auVar79,local_a38);
      auVar82._8_8_ = dStack_d60;
      auVar82._0_8_ = local_d68;
      auVar82._16_8_ = dStack_d58;
      auVar82._24_8_ = dStack_d50;
      auVar75 = vmulpd_avx512vl(auVar82,local_8d0);
      auVar80._8_8_ = dStack_bf8;
      auVar80._0_8_ = local_c00;
      auVar80._16_8_ = dStack_bf0;
      auVar80._24_8_ = dStack_be8;
      auVar64 = vmulpd_avx512vl(auVar64,local_d48);
      auVar76 = vmulpd_avx512vl(auVar81,local_be0);
      auVar77 = vmulpd_avx512vl(local_f70._128_32_,local_e90);
      auVar78 = vmulpd_avx512vl(auVar78,local_d28);
      auVar78 = vaddpd_avx512vl(auVar77,auVar78);
      auVar77 = vmulpd_avx512vl(local_c20,local_bc0);
      auVar78 = vaddpd_avx512vl(auVar78,auVar77);
      auVar79 = vmulpd_avx512vl(auVar79,local_e70);
      auVar77 = vmulpd_avx512vl(auVar82,local_d08);
      auVar79 = vaddpd_avx512vl(auVar79,auVar77);
      auVar80 = vmulpd_avx512vl(auVar80,local_ba0);
      auVar79 = vaddpd_avx512vl(auVar79,auVar80);
      auVar122._0_8_ =
           (auVar70._0_8_ +
           auVar69._0_8_ + auVar68._0_8_ + auVar67._0_8_ + auVar66._0_8_ + auVar65._0_8_) * dVar2;
      auVar122._8_8_ =
           (auVar70._8_8_ +
           auVar69._8_8_ + auVar68._8_8_ + auVar67._8_8_ + auVar66._8_8_ + auVar65._8_8_) * dVar2;
      auVar122._16_8_ =
           (auVar70._16_8_ +
           auVar69._16_8_ + auVar68._16_8_ + auVar67._16_8_ + auVar66._16_8_ + auVar65._16_8_) *
           dVar2;
      auVar122._24_8_ =
           (auVar70._24_8_ +
           auVar69._24_8_ + auVar68._24_8_ + auVar67._24_8_ + auVar66._24_8_ + auVar65._24_8_) *
           dVar2;
      auVar65 = vaddpd_avx512vl(auVar78,auVar122);
      auVar125._0_8_ =
           (local_768._0_8_ * local_c00 +
           auVar75._0_8_ + auVar74._0_8_ + auVar73._0_8_ + auVar72._0_8_ + auVar71._0_8_) * dVar2;
      auVar125._8_8_ =
           (local_768._8_8_ * dStack_bf8 +
           auVar75._8_8_ + auVar74._8_8_ + auVar73._8_8_ + auVar72._8_8_ + auVar71._8_8_) * dVar2;
      auVar125._16_8_ =
           (local_768._16_8_ * dStack_bf0 +
           auVar75._16_8_ + auVar74._16_8_ + auVar73._16_8_ + auVar72._16_8_ + auVar71._16_8_) *
           dVar2;
      auVar125._24_8_ =
           (local_768._24_8_ * dStack_be8 +
           auVar75._24_8_ + auVar74._24_8_ + auVar73._24_8_ + auVar72._24_8_ + auVar71._24_8_) *
           dVar2;
      auVar66 = vaddpd_avx512vl(auVar79,auVar125);
      dVar115 = local_1360._0_8_;
      dVar7 = local_1360._8_8_;
      dVar111 = local_1360._16_8_;
      dVar120 = local_1360._24_8_;
      dStack_1208 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x18);
      local_1260 = (auVar76._0_8_ + auVar64._0_8_ + (double)local_f70._96_8_ * dVar112 +
                   (auVar63._0_8_ +
                   auVar62._0_8_ +
                   auVar61._0_8_ + dVar118 * local_808 + auVar60._0_8_ + dVar112 * local_ad8) *
                   dVar2) * dVar115 * dStack_1208;
      dStack_1258 = (auVar76._8_8_ + auVar64._8_8_ + (double)local_f70._104_8_ * dVar114 +
                    (auVar63._8_8_ +
                    auVar62._8_8_ +
                    auVar61._8_8_ + dVar98 * dStack_800 + auVar60._8_8_ + dVar114 * dStack_ad0) *
                    dVar2) * dVar7 * dStack_1208;
      dStack_1250 = (auVar76._16_8_ + auVar64._16_8_ + (double)local_f70._112_8_ * dVar116 +
                    (auVar63._16_8_ +
                    auVar62._16_8_ +
                    auVar61._16_8_ + dVar100 * dStack_7f8 + auVar60._16_8_ + dVar116 * dStack_ac8) *
                    dVar2) * dVar111 * dStack_1208;
      dStack_1248 = (auVar76._24_8_ + auVar64._24_8_ + (double)local_f70._120_8_ * dVar117 +
                    (auVar63._24_8_ +
                    auVar62._24_8_ +
                    auVar61._24_8_ + dVar101 * dStack_7f0 + auVar60._24_8_ + dVar117 * dStack_ac0) *
                    dVar2) * dVar120 * dStack_1208;
      local_1240 = auVar65._0_8_ * local_1380 * dStack_1208;
      dStack_1238 = auVar65._8_8_ * dStack_1378 * dStack_1208;
      dStack_1230 = auVar65._16_8_ * dStack_1370 * dStack_1208;
      dStack_1228 = auVar65._24_8_ * dStack_1368 * dStack_1208;
      local_1220 = dStack_1208 * auVar66._0_8_ * local_1600;
      dStack_1218 = dStack_1208 * auVar66._8_8_ * dStack_15f8;
      dStack_1210 = dStack_1208 * auVar66._16_8_ * dStack_15f0;
      dStack_1208 = dStack_1208 * auVar66._24_8_ * dStack_15e8;
      auVar29._8_8_ = dStack_b30;
      auVar29._0_8_ = local_b38;
      auVar29._16_8_ = dStack_b28;
      auVar29._24_8_ = dStack_b20;
      auVar60 = vmulpd_avx512vl(auVar29,local_eb0);
      local_15e0 = local_eb0;
      auVar85._8_8_ = dStack_9c8;
      auVar85._0_8_ = local_9d0;
      auVar85._16_8_ = dStack_9c0;
      auVar85._24_8_ = dStack_9b8;
      auVar61 = vmulpd_avx512vl(local_d48,auVar85);
      auVar60 = vaddpd_avx512vl(auVar60,auVar61);
      auVar28._8_8_ = dStack_860;
      auVar28._0_8_ = local_868;
      auVar28._16_8_ = dStack_858;
      auVar28._24_8_ = dStack_850;
      auVar61 = vmulpd_avx512vl(auVar28,local_be0);
      local_12c0 = local_be0;
      auVar60 = vaddpd_avx512vl(auVar60,auVar61);
      auVar11._8_8_ = local_f70._8_8_;
      auVar11._0_8_ = local_f70._0_8_;
      auVar11._16_8_ = local_f70._16_8_;
      auVar11._24_8_ = local_f70._24_8_;
      auVar83._8_8_ = dStack_e00;
      auVar83._0_8_ = local_e08;
      auVar83._16_8_ = dStack_df8;
      auVar83._24_8_ = dStack_df0;
      auVar61 = vmulpd_avx512vl(auVar83,auVar59);
      auVar30._8_8_ = dStack_c98;
      auVar30._0_8_ = local_ca0;
      auVar30._16_8_ = dStack_c90;
      auVar30._24_8_ = dStack_c88;
      auVar33._8_8_ = dStack_b10;
      auVar33._0_8_ = local_b18;
      auVar33._16_8_ = dStack_b08;
      auVar33._24_8_ = dStack_b00;
      auVar62 = vmulpd_avx512vl(auVar33,local_e90);
      _local_15c0 = local_e90;
      auVar59 = _local_15c0;
      auVar32._8_8_ = dStack_9a8;
      auVar32._0_8_ = local_9b0;
      auVar32._16_8_ = dStack_9a0;
      auVar32._24_8_ = dStack_998;
      local_1540 = local_d28;
      auVar63 = vmulpd_avx512vl(auVar32,local_d28);
      auVar31._8_8_ = dStack_840;
      auVar31._0_8_ = local_848;
      auVar31._16_8_ = dStack_838;
      auVar31._24_8_ = dStack_830;
      auVar64 = vmulpd_avx512vl(auVar31,local_bc0);
      local_12a0 = local_bc0;
      auVar72._8_8_ = local_f70._40_8_;
      auVar72._0_8_ = local_f70._32_8_;
      auVar72._16_8_ = local_f70._48_8_;
      auVar72._24_8_ = local_f70._56_8_;
      auVar65 = vmulpd_avx512vl(auVar72,local_a58);
      auVar12._8_8_ = dStack_de0;
      auVar12._0_8_ = local_de8;
      auVar12._16_8_ = dStack_dd8;
      auVar12._24_8_ = dStack_dd0;
      auVar34._8_8_ = dStack_c78;
      auVar34._0_8_ = local_c80;
      auVar34._16_8_ = dStack_c70;
      auVar34._24_8_ = dStack_c68;
      auVar35._8_8_ = dStack_af0;
      auVar35._0_8_ = local_af8;
      auVar35._16_8_ = dStack_ae8;
      auVar35._24_8_ = dStack_ae0;
      local_12e0 = local_e70;
      auVar66 = vmulpd_avx512vl(auVar35,local_e70);
      auVar36._8_8_ = dStack_988;
      auVar36._0_8_ = local_990;
      auVar36._16_8_ = dStack_980;
      auVar36._24_8_ = dStack_978;
      auVar78 = vmulpd_avx512vl(auVar36,local_d08);
      local_1280 = local_ba0;
      auVar75._8_8_ = dStack_820;
      auVar75._0_8_ = local_828;
      auVar75._16_8_ = dStack_818;
      auVar75._24_8_ = dStack_810;
      auVar67 = vmulpd_avx512vl(local_ba0,auVar75);
      auVar38._8_8_ = local_f70._72_8_;
      auVar38._0_8_ = local_f70._64_8_;
      auVar38._16_8_ = local_f70._80_8_;
      auVar38._24_8_ = local_f70._88_8_;
      auVar79 = vmulpd_avx512vl(auVar38,local_a38);
      auVar77._8_8_ = dStack_dc0;
      auVar77._0_8_ = local_dc8;
      auVar77._16_8_ = dStack_db8;
      auVar77._24_8_ = dStack_db0;
      auVar68 = vmulpd_avx512vl(auVar77,local_8d0);
      auVar37._8_8_ = dStack_c58;
      auVar37._0_8_ = local_c60;
      auVar37._16_8_ = dStack_c50;
      auVar37._24_8_ = dStack_c48;
      auVar69 = vmulpd_avx512vl(auVar37,local_768);
      auVar80 = vmulpd_avx512vl(auVar11,local_eb0);
      local_1560 = local_d48;
      auVar70 = vmulpd_avx512vl(auVar83,local_d48);
      auVar71 = vmulpd_avx512vl(auVar72,local_e90);
      auVar73 = vmulpd_avx512vl(auVar12,local_d28);
      auVar74 = vmulpd_avx512vl(auVar38,local_e70);
      auVar75 = vmulpd_avx512vl(auVar77,local_d08);
      auVar76 = vmulpd_avx512vl(auVar37,local_ba0);
      auVar103._0_8_ =
           auVar71._0_8_ + auVar73._0_8_ + local_c80 * dVar90 +
           dVar2 * (local_c80 * local_788._0_8_ +
                   local_de8 * local_8f0._0_8_ +
                   auVar65._0_8_ + auVar64._0_8_ + auVar63._0_8_ + auVar62._0_8_);
      auVar103._8_8_ =
           auVar71._8_8_ + auVar73._8_8_ + dStack_c78 * dVar93 +
           dVar2 * (dStack_c78 * local_788._8_8_ +
                   dStack_de0 * local_8f0._8_8_ +
                   auVar65._8_8_ + auVar64._8_8_ + auVar63._8_8_ + auVar62._8_8_);
      auVar103._16_8_ =
           auVar71._16_8_ + auVar73._16_8_ + dStack_c70 * dVar95 +
           dVar2 * (dStack_c70 * local_788._16_8_ +
                   dStack_dd8 * local_8f0._16_8_ +
                   auVar65._16_8_ + auVar64._16_8_ + auVar63._16_8_ + auVar62._16_8_);
      auVar103._24_8_ =
           auVar71._24_8_ + auVar73._24_8_ + dStack_c68 * dVar97 +
           dVar2 * (dStack_c68 * local_788._24_8_ +
                   dStack_dd0 * local_8f0._24_8_ +
                   auVar65._24_8_ + auVar64._24_8_ + auVar63._24_8_ + auVar62._24_8_);
      auVar62 = vmulpd_avx512vl(auVar88,auVar103);
      dVar102 = *(double *)
                 ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x20);
      auVar106._0_8_ =
           dVar115 * (auVar80._0_8_ + auVar70._0_8_ + local_ca0 * dVar118 +
                     dVar2 * (local_ca0 * local_7a8._0_8_ +
                             local_a78._0_8_ * (double)local_f70._0_8_ + auVar60._0_8_ +
                             auVar61._0_8_)) * dVar102;
      auVar106._8_8_ =
           dVar7 * (auVar80._8_8_ + auVar70._8_8_ + dStack_c98 * dVar98 +
                   dVar2 * (dStack_c98 * local_7a8._8_8_ +
                           local_a78._8_8_ * (double)local_f70._8_8_ + auVar60._8_8_ + auVar61._8_8_
                           )) * dVar102;
      auVar106._16_8_ =
           dVar111 * (auVar80._16_8_ + auVar70._16_8_ + dStack_c90 * dVar100 +
                     dVar2 * (dStack_c90 * local_7a8._16_8_ +
                             local_a78._16_8_ * (double)local_f70._16_8_ + auVar60._16_8_ +
                             auVar61._16_8_)) * dVar102;
      auVar106._24_8_ =
           dVar120 * (auVar80._24_8_ + auVar70._24_8_ + dStack_c88 * dVar101 +
                     dVar2 * (dStack_c88 * local_7a8._24_8_ +
                             local_a78._24_8_ * (double)local_f70._24_8_ + auVar60._24_8_ +
                             auVar61._24_8_)) * dVar102;
      local_16c0._0_8_ = auVar62._0_8_ * dVar102;
      local_16c0._8_8_ = auVar62._8_8_ * dVar102;
      dStack_16b0 = auVar62._16_8_ * dVar102;
      dStack_16a8 = auVar62._24_8_ * dVar102;
      dVar98 = dVar102 * local_1600 *
                         (auVar76._0_8_ + auVar75._0_8_ + auVar74._0_8_ +
                         dVar2 * (auVar69._0_8_ +
                                 auVar68._0_8_ +
                                 auVar79._0_8_ + auVar66._0_8_ + auVar78._0_8_ + auVar67._0_8_));
      dVar100 = dVar102 * dStack_15f8 *
                          (auVar76._8_8_ + auVar75._8_8_ + auVar74._8_8_ +
                          dVar2 * (auVar69._8_8_ +
                                  auVar68._8_8_ +
                                  auVar79._8_8_ + auVar66._8_8_ + auVar78._8_8_ + auVar67._8_8_));
      dVar101 = dVar102 * dStack_15f0 *
                          (auVar76._16_8_ + auVar75._16_8_ + auVar74._16_8_ +
                          dVar2 * (auVar69._16_8_ +
                                  auVar68._16_8_ +
                                  auVar79._16_8_ + auVar66._16_8_ + auVar78._16_8_ + auVar67._16_8_)
                          );
      dVar102 = dVar102 * dStack_15e8 *
                          (auVar76._24_8_ + auVar75._24_8_ + auVar74._24_8_ +
                          dVar2 * (auVar69._24_8_ +
                                  auVar68._24_8_ +
                                  auVar79._24_8_ + auVar66._24_8_ + auVar78._24_8_ + auVar67._24_8_)
                          );
      auVar62._8_8_ = local_f70._104_8_;
      auVar62._0_8_ = local_f70._96_8_;
      auVar62._16_8_ = local_f70._112_8_;
      auVar62._24_8_ = local_f70._120_8_;
      auVar60 = vmulpd_avx512vl(auVar29,auVar62);
      auVar65._8_8_ = dStack_da0;
      auVar65._0_8_ = local_da8;
      auVar65._16_8_ = dStack_d98;
      auVar65._24_8_ = dStack_d90;
      auVar86._8_8_ = dStack_9c8;
      auVar86._0_8_ = local_9d0;
      auVar86._16_8_ = dStack_9c0;
      auVar86._24_8_ = dStack_9b8;
      auVar61 = vmulpd_avx512vl(auVar65,auVar86);
      auVar9._8_8_ = dStack_c38;
      auVar9._0_8_ = local_c40;
      auVar9._16_8_ = dStack_c30;
      auVar9._24_8_ = dStack_c28;
      auVar63 = vmulpd_avx512vl(auVar28,auVar9);
      auVar19._8_8_ = dStack_800;
      auVar19._0_8_ = local_808;
      auVar19._16_8_ = dStack_7f8;
      auVar19._24_8_ = dStack_7f0;
      auVar64 = vmulpd_avx512vl(auVar30,auVar19);
      auVar66 = vmulpd_avx512vl(auVar33,local_f70._128_32_);
      auVar67._8_8_ = dStack_d80;
      auVar67._0_8_ = local_d88;
      auVar67._16_8_ = dStack_d78;
      auVar67._24_8_ = dStack_d70;
      auVar78 = vmulpd_avx512vl(auVar32,auVar67);
      auVar79 = vmulpd_avx512vl(auVar31,local_c20);
      auVar15._8_8_ = dStack_ab0;
      auVar15._0_8_ = local_ab8;
      auVar15._16_8_ = dStack_aa8;
      auVar15._24_8_ = dStack_aa0;
      auVar69 = vmulpd_avx512vl(auVar72,auVar15);
      auVar23._8_8_ = dStack_948;
      auVar23._0_8_ = local_950;
      auVar23._16_8_ = dStack_940;
      auVar23._24_8_ = dStack_938;
      auVar80 = vmulpd_avx512vl(auVar12,auVar23);
      auVar68._8_8_ = dStack_ec8;
      auVar68._0_8_ = local_ed0;
      auVar68._16_8_ = dStack_ec0;
      auVar68._24_8_ = dStack_eb8;
      auVar10._8_8_ = dStack_d60;
      auVar10._0_8_ = local_d68;
      auVar10._16_8_ = dStack_d58;
      auVar10._24_8_ = dStack_d50;
      auVar71 = vmulpd_avx512vl(auVar36,auVar10);
      auVar70._8_8_ = dStack_bf8;
      auVar70._0_8_ = local_c00;
      auVar70._16_8_ = dStack_bf0;
      auVar70._24_8_ = dStack_be8;
      auVar76._8_8_ = dStack_820;
      auVar76._0_8_ = local_828;
      auVar76._16_8_ = dStack_818;
      auVar76._24_8_ = dStack_810;
      auVar73 = vmulpd_avx512vl(auVar70,auVar76);
      auVar74._8_8_ = dStack_a90;
      auVar74._0_8_ = local_a98;
      auVar74._16_8_ = dStack_a88;
      auVar74._24_8_ = dStack_a80;
      auVar74 = vmulpd_avx512vl(auVar38,auVar74);
      auVar21._8_8_ = dStack_928;
      auVar21._0_8_ = local_930;
      auVar21._16_8_ = dStack_920;
      auVar21._24_8_ = dStack_918;
      auVar75 = vmulpd_avx512vl(auVar77,auVar21);
      auVar17._8_8_ = dStack_7c0;
      auVar17._0_8_ = local_7c8;
      auVar17._16_8_ = dStack_7b8;
      auVar17._24_8_ = dStack_7b0;
      auVar76 = vmulpd_avx512vl(auVar37,auVar17);
      auVar81 = vmulpd_avx512vl(auVar11,auVar62);
      auVar82 = vmulpd_avx512vl(auVar83,auVar65);
      auVar83 = vmulpd_avx512vl(auVar30,auVar9);
      auVar84 = vmulpd_avx512vl(auVar72,local_f70._128_32_);
      auVar67 = vmulpd_avx512vl(auVar12,auVar67);
      auVar85 = vmulpd_avx512vl(auVar34,local_c20);
      auVar86 = vmulpd_avx512vl(auVar38,auVar68);
      auVar87 = vmulpd_avx512vl(auVar77,auVar10);
      auVar70 = vmulpd_avx512vl(auVar37,auVar70);
      auVar109._0_8_ =
           auVar84._0_8_ + auVar67._0_8_ + auVar85._0_8_ +
           dVar2 * (local_c80 * local_7e8 +
                   auVar80._0_8_ + auVar69._0_8_ + auVar66._0_8_ + auVar78._0_8_ + auVar79._0_8_);
      auVar109._8_8_ =
           auVar84._8_8_ + auVar67._8_8_ + auVar85._8_8_ +
           dVar2 * (dStack_c78 * dStack_7e0 +
                   auVar80._8_8_ + auVar69._8_8_ + auVar66._8_8_ + auVar78._8_8_ + auVar79._8_8_);
      auVar109._16_8_ =
           auVar84._16_8_ + auVar67._16_8_ + auVar85._16_8_ +
           dVar2 * (dStack_c70 * dStack_7d8 +
                   auVar80._16_8_ +
                   auVar69._16_8_ + auVar66._16_8_ + auVar78._16_8_ + auVar79._16_8_);
      auVar109._24_8_ =
           auVar84._24_8_ + auVar67._24_8_ + auVar85._24_8_ +
           dVar2 * (dStack_c68 * dStack_7d0 +
                   auVar80._24_8_ +
                   auVar69._24_8_ + auVar66._24_8_ + auVar78._24_8_ + auVar79._24_8_);
      dVar118 = *(double *)
                 ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x28);
      auVar88 = vmulpd_avx512vl(auVar88,auVar109);
      auVar110._0_8_ =
           dVar115 * (auVar81._0_8_ + auVar82._0_8_ + auVar83._0_8_ +
                     dVar2 * (auVar64._0_8_ +
                             local_e08 * local_970 +
                             (double)local_f70._0_8_ * local_ad8 +
                             auVar60._0_8_ + auVar61._0_8_ + auVar63._0_8_)) * dVar118;
      auVar110._8_8_ =
           dVar7 * (auVar81._8_8_ + auVar82._8_8_ + auVar83._8_8_ +
                   dVar2 * (auVar64._8_8_ +
                           dStack_e00 * dStack_968 +
                           (double)local_f70._8_8_ * dStack_ad0 +
                           auVar60._8_8_ + auVar61._8_8_ + auVar63._8_8_)) * dVar118;
      auVar110._16_8_ =
           dVar111 * (auVar81._16_8_ + auVar82._16_8_ + auVar83._16_8_ +
                     dVar2 * (auVar64._16_8_ +
                             dStack_df8 * dStack_960 +
                             (double)local_f70._16_8_ * dStack_ac8 +
                             auVar60._16_8_ + auVar61._16_8_ + auVar63._16_8_)) * dVar118;
      auVar110._24_8_ =
           dVar120 * (auVar81._24_8_ + auVar82._24_8_ + auVar83._24_8_ +
                     dVar2 * (auVar64._24_8_ +
                             dStack_df0 * dStack_958 +
                             (double)local_f70._24_8_ * dStack_ac0 +
                             auVar60._24_8_ + auVar61._24_8_ + auVar63._24_8_)) * dVar118;
      auVar107._0_8_ = auVar88._0_8_ * dVar118;
      auVar107._8_8_ = auVar88._8_8_ * dVar118;
      auVar107._16_8_ = auVar88._16_8_ * dVar118;
      auVar107._24_8_ = auVar88._24_8_ * dVar118;
      auVar91._0_8_ =
           local_1600 *
           (auVar86._0_8_ + auVar87._0_8_ + auVar70._0_8_ +
           dVar2 * (auVar76._0_8_ +
                   auVar75._0_8_ +
                   auVar74._0_8_ + auVar73._0_8_ + auVar71._0_8_ + local_af8 * local_ed0)) * dVar118
      ;
      auVar91._8_8_ =
           dStack_15f8 *
           (auVar86._8_8_ + auVar87._8_8_ + auVar70._8_8_ +
           dVar2 * (auVar76._8_8_ +
                   auVar75._8_8_ +
                   auVar74._8_8_ + auVar73._8_8_ + auVar71._8_8_ + dStack_af0 * dStack_ec8)) *
           dVar118;
      auVar91._16_8_ =
           dStack_15f0 *
           (auVar86._16_8_ + auVar87._16_8_ + auVar70._16_8_ +
           dVar2 * (auVar76._16_8_ +
                   auVar75._16_8_ +
                   auVar74._16_8_ + auVar73._16_8_ + auVar71._16_8_ + dStack_ae8 * dStack_ec0)) *
           dVar118;
      auVar91._24_8_ =
           dStack_15e8 *
           (auVar86._24_8_ + auVar87._24_8_ + auVar70._24_8_ +
           dVar2 * (auVar76._24_8_ +
                   auVar75._24_8_ +
                   auVar74._24_8_ + auVar73._24_8_ + auVar71._24_8_ + dStack_ae0 * dStack_eb8)) *
           dVar118;
      auVar44._8_8_ = dStack_fd8;
      auVar44._0_8_ = local_fe0;
      auVar44._16_8_ = dStack_fd0;
      auVar44._24_8_ = dStack_fc8;
      auVar88 = vmulpd_avx512vl(auVar11,auVar44);
      auVar60 = vmulpd_avx512vl(auVar62,auVar110);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0] = dVar112 * auVar106._0_8_ + auVar60._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[1] = dVar114 * auVar106._8_8_ + auVar60._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[2] = dVar116 * auVar106._16_8_ + auVar60._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[3] = dVar117 * auVar106._24_8_ + auVar60._24_8_ + auVar88._24_8_;
      auVar45._8_8_ = dStack_fb8;
      auVar45._0_8_ = local_fc0;
      auVar45._16_8_ = dStack_fb0;
      auVar45._24_8_ = dStack_fa8;
      auVar88 = vmulpd_avx512vl(auVar72,auVar45);
      auVar60 = vmulpd_avx512vl(local_f70._128_32_,auVar107);
      local_15c0._0_8_ = local_e90._0_8_;
      local_15c0._8_8_ = local_e90._8_8_;
      dStack_15b0 = local_e90._16_8_;
      dStack_15a8 = local_e90._24_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[4] = (double)local_15c0._0_8_ * (double)local_16c0._0_8_ + auVar60._0_8_ + auVar88._0_8_
      ;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[5] = (double)local_15c0._8_8_ * (double)local_16c0._8_8_ + auVar60._8_8_ + auVar88._8_8_
      ;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[6] = dStack_15b0 * dStack_16b0 + auVar60._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[7] = dStack_15a8 * dStack_16a8 + auVar60._24_8_ + auVar88._24_8_;
      auVar46._8_8_ = dStack_f98;
      auVar46._0_8_ = local_fa0;
      auVar46._16_8_ = dStack_f90;
      auVar46._24_8_ = dStack_f88;
      auVar60 = vmulpd_avx512vl(auVar38,auVar46);
      auVar88._8_8_ = dVar100;
      auVar88._0_8_ = dVar98;
      auVar88._16_8_ = dVar101;
      auVar88._24_8_ = dVar102;
      auVar61 = vmulpd_avx512vl(local_e70,auVar88);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[8] = auVar61._0_8_ + local_ed0 * auVar91._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[9] = auVar61._8_8_ + dStack_ec8 * auVar91._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[10] = auVar61._16_8_ + dStack_ec0 * auVar91._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xb] = auVar61._24_8_ + dStack_eb8 * auVar91._24_8_ + auVar60._24_8_;
      auVar84._8_8_ = dStack_e00;
      auVar84._0_8_ = local_e08;
      auVar84._16_8_ = dStack_df8;
      auVar84._24_8_ = dStack_df0;
      auVar60 = vmulpd_avx512vl(auVar84,auVar44);
      auVar61 = vmulpd_avx512vl(auVar65,auVar110);
      auVar63 = vmulpd_avx512vl(auVar106,local_d48);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2d] = auVar63._0_8_ + auVar61._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2e] = auVar63._8_8_ + auVar61._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2f] = auVar63._16_8_ + auVar61._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x30] = auVar63._24_8_ + auVar61._24_8_ + auVar60._24_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x31] = (double)local_16c0._0_8_ * dVar113 +
                    local_d88 * auVar107._0_8_ + local_fc0 * local_de8;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x32] = (double)local_16c0._8_8_ * dVar6 +
                    dStack_d80 * auVar107._8_8_ + dStack_fb8 * dStack_de0;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x33] = dStack_16b0 * dVar108 + dStack_d78 * auVar107._16_8_ + dStack_fb0 * dStack_dd8;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x34] = dStack_16a8 * dVar119 + dStack_d70 * auVar107._24_8_ + dStack_fa8 * dStack_dd0;
      auVar60 = vmulpd_avx512vl(auVar77,auVar46);
      auVar61 = vmulpd_avx512vl(auVar10,auVar91);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x35] = local_d08._0_8_ * dVar98 + auVar61._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x36] = local_d08._8_8_ * dVar100 + auVar61._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x37] = local_d08._16_8_ * dVar101 + auVar61._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x38] = local_d08._24_8_ * dVar102 + auVar61._24_8_ + auVar60._24_8_;
      auVar60 = vmulpd_avx512vl(auVar30,auVar44);
      auVar61 = vmulpd_avx512vl(auVar9,auVar110);
      auVar63 = vmulpd_avx512vl(local_be0,auVar106);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5a] = auVar63._0_8_ + auVar61._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5b] = auVar63._8_8_ + auVar61._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5c] = auVar63._16_8_ + auVar61._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5d] = auVar63._24_8_ + auVar61._24_8_ + auVar60._24_8_;
      auVar60 = vmulpd_avx512vl(auVar34,auVar45);
      auVar61 = vmulpd_avx512vl(local_c20,auVar107);
      auVar63 = vmulpd_avx512vl(local_bc0,_local_16c0);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5e] = auVar63._0_8_ + auVar61._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5f] = auVar63._8_8_ + auVar61._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x60] = auVar63._16_8_ + auVar61._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x61] = auVar63._24_8_ + auVar61._24_8_ + auVar60._24_8_;
      auVar60 = vmulpd_avx512vl(auVar37,auVar46);
      auVar71._8_8_ = dStack_bf8;
      auVar71._0_8_ = local_c00;
      auVar71._16_8_ = dStack_bf0;
      auVar71._24_8_ = dStack_be8;
      auVar61 = vmulpd_avx512vl(auVar71,auVar91);
      auVar88 = vmulpd_avx512vl(local_ba0,auVar88);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x62] = auVar88._0_8_ + auVar61._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[99] = auVar88._8_8_ + auVar61._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[100] = auVar88._16_8_ + auVar61._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x65] = auVar88._24_8_ + auVar61._24_8_ + auVar60._24_8_;
      auVar87._8_8_ = local_f70._8_8_;
      auVar87._0_8_ = local_f70._0_8_;
      auVar87._16_8_ = local_f70._16_8_;
      auVar87._24_8_ = local_f70._24_8_;
      auVar88 = vmulpd_avx512vl(auVar87,auVar110);
      auVar40._8_8_ = dStack_1058;
      auVar40._0_8_ = local_1060;
      auVar40._16_8_ = dStack_1050;
      auVar40._24_8_ = dStack_1048;
      auVar60 = vmulpd_avx512vl(auVar62,auVar40);
      auVar25._8_8_ = dStack_1258;
      auVar25._0_8_ = local_1260;
      auVar25._16_8_ = dStack_1250;
      auVar25._24_8_ = dStack_1248;
      auVar61 = vmulpd_avx512vl(local_eb0,auVar25);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xc] = auVar61._0_8_ + auVar60._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xd] = auVar61._8_8_ + auVar60._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xe] = auVar61._16_8_ + auVar60._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xf] = auVar61._24_8_ + auVar60._24_8_ + auVar88._24_8_;
      auVar42._8_8_ = dStack_1018;
      auVar42._0_8_ = local_1020;
      auVar42._16_8_ = dStack_1010;
      auVar42._24_8_ = dStack_1008;
      auVar88 = vmulpd_avx512vl(local_f70._128_32_,auVar42);
      auVar26._8_8_ = dStack_1238;
      auVar26._0_8_ = local_1240;
      auVar26._16_8_ = dStack_1230;
      auVar26._24_8_ = dStack_1228;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x10] = (double)local_15c0._0_8_ * local_1240 +
                    auVar88._0_8_ + auVar107._0_8_ * (double)local_f70._32_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x11] = (double)local_15c0._8_8_ * dStack_1238 +
                    auVar88._8_8_ + auVar107._8_8_ * (double)local_f70._40_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x12] = dStack_15b0 * dStack_1230 +
                    auVar88._16_8_ + auVar107._16_8_ * (double)local_f70._48_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x13] = dStack_15a8 * dStack_1228 +
                    auVar88._24_8_ + auVar107._24_8_ * (double)local_f70._56_8_;
      auVar88 = vmulpd_avx512vl(auVar38,auVar91);
      auVar43._8_8_ = dStack_ff8;
      auVar43._0_8_ = local_1000;
      auVar43._16_8_ = dStack_ff0;
      auVar43._24_8_ = dStack_fe8;
      auVar60 = vmulpd_avx512vl(auVar68,auVar43);
      auVar27._8_8_ = dStack_1218;
      auVar27._0_8_ = local_1220;
      auVar27._16_8_ = dStack_1210;
      auVar27._24_8_ = dStack_1208;
      auVar61 = vmulpd_avx512vl(local_e70,auVar27);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x14] = auVar61._0_8_ + auVar60._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x15] = auVar61._8_8_ + auVar60._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x16] = auVar61._16_8_ + auVar60._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x17] = auVar61._24_8_ + auVar60._24_8_ + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar84,auVar110);
      auVar60 = vmulpd_avx512vl(auVar65,auVar40);
      auVar61 = vmulpd_avx512vl(local_d48,auVar25);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x39] = auVar61._0_8_ + auVar60._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3a] = auVar61._8_8_ + auVar60._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3b] = auVar61._16_8_ + auVar60._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3c] = auVar61._24_8_ + auVar60._24_8_ + auVar88._24_8_;
      auVar13._8_8_ = dStack_de0;
      auVar13._0_8_ = local_de8;
      auVar13._16_8_ = dStack_dd8;
      auVar13._24_8_ = dStack_dd0;
      auVar88 = vmulpd_avx512vl(auVar13,auVar107);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3d] = dVar113 * local_1240 + local_d88 * local_1020 + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3e] = dVar6 * dStack_1238 + dStack_d80 * dStack_1018 + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3f] = dVar108 * dStack_1230 + dStack_d78 * dStack_1010 + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x40] = dVar119 * dStack_1228 + dStack_d70 * dStack_1008 + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar10,auVar43);
      auVar60 = vmulpd_avx512vl(local_d08,auVar27);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x41] = auVar60._0_8_ + auVar88._0_8_ + local_dc8 * auVar91._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x42] = auVar60._8_8_ + auVar88._8_8_ + dStack_dc0 * auVar91._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x43] = auVar60._16_8_ + auVar88._16_8_ + dStack_db8 * auVar91._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x44] = auVar60._24_8_ + auVar88._24_8_ + dStack_db0 * auVar91._24_8_;
      auVar88 = vmulpd_avx512vl(auVar9,auVar40);
      auVar60 = vmulpd_avx512vl(local_be0,auVar25);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x66] = auVar60._0_8_ + auVar88._0_8_ + local_ca0 * auVar110._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x67] = auVar60._8_8_ + auVar88._8_8_ + dStack_c98 * auVar110._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x68] = auVar60._16_8_ + auVar88._16_8_ + dStack_c90 * auVar110._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x69] = auVar60._24_8_ + auVar88._24_8_ + dStack_c88 * auVar110._24_8_;
      auVar88 = vmulpd_avx512vl(auVar34,auVar107);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6a] = dVar90 * local_1240 + dVar89 * local_1020 + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6b] = dVar93 * dStack_1238 + dVar92 * dStack_1018 + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6c] = dVar95 * dStack_1230 + dVar94 * dStack_1010 + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6d] = dVar97 * dStack_1228 + dVar96 * dStack_1008 + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar37,auVar91);
      auVar60 = vmulpd_avx512vl(auVar71,auVar43);
      auVar61 = vmulpd_avx512vl(local_ba0,auVar27);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6e] = auVar60._0_8_ + auVar88._0_8_ + auVar61._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6f] = auVar60._8_8_ + auVar88._8_8_ + auVar61._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x70] = auVar60._16_8_ + auVar88._16_8_ + auVar61._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x71] = auVar60._24_8_ + auVar88._24_8_ + auVar61._24_8_;
      auVar88 = vmulpd_avx512vl(auVar87,auVar106);
      auVar63._8_8_ = local_f70._104_8_;
      auVar63._0_8_ = local_f70._96_8_;
      auVar63._16_8_ = local_f70._112_8_;
      auVar63._24_8_ = local_f70._120_8_;
      auVar60 = vmulpd_avx512vl(auVar25,auVar63);
      auVar39._8_8_ = dStack_1098;
      auVar39._0_8_ = local_10a0;
      auVar39._16_8_ = dStack_1090;
      auVar39._24_8_ = dStack_1088;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x18] = local_10a0 * dVar112 + auVar60._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x19] = dStack_1098 * dVar114 + auVar60._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1a] = dStack_1090 * dVar116 + auVar60._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1b] = dStack_1088 * dVar117 + auVar60._24_8_ + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(local_f70._128_32_,auVar26);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1c] = local_1080 * (double)local_15c0._0_8_ +
                    auVar88._0_8_ + (double)local_16c0._0_8_ * (double)local_f70._32_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1d] = dStack_1078 * (double)local_15c0._8_8_ +
                    auVar88._8_8_ + (double)local_16c0._8_8_ * (double)local_f70._40_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1e] = dStack_1070 * dStack_15b0 +
                    auVar88._16_8_ + dStack_16b0 * (double)local_f70._48_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1f] = dStack_1068 * dStack_15a8 +
                    auVar88._24_8_ + dStack_16a8 * (double)local_f70._56_8_;
      auVar60._8_8_ = dVar100;
      auVar60._0_8_ = dVar98;
      auVar60._16_8_ = dVar101;
      auVar60._24_8_ = dVar102;
      auVar88 = vmulpd_avx512vl(auVar38,auVar60);
      auVar69._8_8_ = dStack_ec8;
      auVar69._0_8_ = local_ed0;
      auVar69._16_8_ = dStack_ec0;
      auVar69._24_8_ = dStack_eb8;
      auVar61 = vmulpd_avx512vl(auVar27,auVar69);
      auVar41._8_8_ = dStack_1038;
      auVar41._0_8_ = local_1040;
      auVar41._16_8_ = dStack_1030;
      auVar41._24_8_ = dStack_1028;
      auVar62 = vmulpd_avx512vl(local_e70,auVar41);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x20] = auVar62._0_8_ + auVar88._0_8_ + auVar61._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x21] = auVar62._8_8_ + auVar88._8_8_ + auVar61._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x22] = auVar62._16_8_ + auVar88._16_8_ + auVar61._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x23] = auVar62._24_8_ + auVar88._24_8_ + auVar61._24_8_;
      auVar88 = vmulpd_avx512vl(auVar84,auVar106);
      auVar66._8_8_ = dStack_da0;
      auVar66._0_8_ = local_da8;
      auVar66._16_8_ = dStack_d98;
      auVar66._24_8_ = dStack_d90;
      auVar61 = vmulpd_avx512vl(auVar25,auVar66);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x45] = local_d48._0_8_ * local_10a0 + auVar61._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x46] = local_d48._8_8_ * dStack_1098 + auVar61._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x47] = local_d48._16_8_ * dStack_1090 + auVar61._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x48] = local_d48._24_8_ * dStack_1088 + auVar61._24_8_ + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar13,_local_16c0);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x49] = local_1080 * dVar113 + local_1240 * local_d88 + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4a] = dStack_1078 * dVar6 + dStack_1238 * dStack_d80 + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4b] = dStack_1070 * dVar108 + dStack_1230 * dStack_d78 + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4c] = dStack_1068 * dVar119 + dStack_1228 * dStack_d70 + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar10,auVar27);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4d] = local_1040 * local_d08._0_8_ + local_dc8 * dVar98 + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4e] = dStack_1038 * local_d08._8_8_ + dStack_dc0 * dVar100 + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4f] = dStack_1030 * local_d08._16_8_ + dStack_db8 * dVar101 + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x50] = dStack_1028 * local_d08._24_8_ + dStack_db0 * dVar102 + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar30,auVar106);
      auVar61 = vmulpd_avx512vl(auVar9,auVar25);
      auVar62 = vmulpd_avx512vl(local_be0,auVar39);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x72] = auVar62._0_8_ + auVar61._0_8_ + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x73] = auVar62._8_8_ + auVar61._8_8_ + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x74] = auVar62._16_8_ + auVar61._16_8_ + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x75] = auVar62._24_8_ + auVar61._24_8_ + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar34,_local_16c0);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x76] = dVar90 * local_1080 + dVar89 * local_1240 + auVar88._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x77] = dVar93 * dStack_1078 + dVar92 * dStack_1238 + auVar88._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x78] = dVar95 * dStack_1070 + dVar94 * dStack_1230 + auVar88._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x79] = dVar97 * dStack_1068 + dVar96 * dStack_1228 + auVar88._24_8_;
      auVar88 = vmulpd_avx512vl(auVar37,auVar60);
      auVar60 = vmulpd_avx512vl(auVar71,auVar27);
      auVar61 = vmulpd_avx512vl(local_ba0,auVar41);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7a] = auVar61._0_8_ + auVar88._0_8_ + auVar60._0_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7b] = auVar61._8_8_ + auVar88._8_8_ + auVar60._8_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7c] = auVar61._16_8_ + auVar88._16_8_ + auVar60._16_8_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7d] = auVar61._24_8_ + auVar88._24_8_ + auVar60._24_8_;
      _local_15c0 = auVar59;
      if (((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows == 3) &&
         ((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols == 1)) {
        pdVar49 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar2;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_e40 * local_a08 + local_cd8 * local_8a0 + local_b70 * local_738;
        auVar52 = vmulsd_avx512f(auVar8,auVar55);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = local_e40 * local_e40 + local_cd8 * local_cd8 + local_b70 * local_b70 + -1.0
        ;
        auVar53 = vmulsd_avx512f(auVar53,ZEXT816(0x3fe0000000000000));
        auVar54 = vmovddup_avx512vl(auVar8);
        dVar113 = auVar54._0_8_;
        dVar115 = auVar54._8_8_;
        dVar102 = *pdVar49;
        dVar118 = pdVar49[1];
        dVar2 = pdVar49[2];
        auVar127._8_8_ = 0;
        auVar127._0_8_ = local_b58;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_720;
        auVar54 = vmulsd_avx512f(auVar127,auVar54);
        auVar123._8_8_ = 0;
        auVar123._0_8_ = local_e28 * local_9f0 + local_cc0 * local_888;
        auVar54 = vaddsd_avx512f(auVar123,auVar54);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = local_e28 * local_e28 + local_cc0 * local_cc0 + local_b58 * local_b58 + -1.0
        ;
        auVar55 = vmulsd_avx512f(auVar58,ZEXT816(0x3fe0000000000000));
        auVar54 = vmulsd_avx512f(auVar8,auVar54);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = local_870;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = local_ca8;
        auVar56 = vmulsd_avx512f(auVar129,auVar56);
        auVar128._8_8_ = 0;
        auVar128._0_8_ = local_e10 * local_9d8;
        auVar56 = vaddsd_avx512f(auVar128,auVar56);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_708;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = local_b40;
        auVar57 = vmulsd_avx512f(auVar131,auVar57);
        auVar56 = vaddsd_avx512f(auVar56,auVar57);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = local_ca8;
        auVar57 = vmulsd_avx512f(auVar129,auVar130);
        auVar132._8_8_ = 0;
        auVar132._0_8_ = local_b40;
        auVar58 = vmulsd_avx512f(auVar131,auVar132);
        auVar104._8_8_ = 0;
        auVar104._0_8_ = local_e10 * local_e10 + auVar57._0_8_ + auVar58._0_8_ + -1.0;
        auVar57 = vmulsd_avx512f(auVar104,ZEXT816(0x3fe0000000000000));
        auVar56 = vmulsd_avx512f(auVar8,auVar56);
        peVar3 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var4 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        dVar108 = dVar102 * ((local_e50 * local_e50 + local_ce8 * local_ce8 + local_b80 * local_b80
                             + -1.0) * 0.5 +
                            dVar113 * (local_e50 * local_a18 + local_ce8 * local_8b0 +
                                      local_b80 * local_748));
        dVar111 = dVar118 * ((dStack_e48 * dStack_e48 + dStack_ce0 * dStack_ce0 +
                              dStack_b78 * dStack_b78 + -1.0) * 0.5 +
                            dVar115 * (dStack_e48 * dStack_a10 + dStack_ce0 * dStack_8a8 +
                                      dStack_b78 * dStack_740));
        dVar6 = (auVar52._0_8_ + auVar53._0_8_) * dVar2;
        dVar119 = ((local_e38 * local_e38 + local_cd0 * local_cd0 + local_b68 * local_b68 + -1.0) *
                   0.5 + (local_e38 * local_a00 + local_cd0 * local_898 + local_b68 * local_730) *
                         dVar113) * dVar102;
        dVar120 = ((dStack_e30 * dStack_e30 + dStack_cc8 * dStack_cc8 + dStack_b60 * dStack_b60 +
                   -1.0) * 0.5 +
                  (dStack_e30 * dStack_9f8 + dStack_cc8 * dStack_890 + dStack_b60 * dStack_728) *
                  dVar115) * dVar118;
        dVar7 = (auVar54._0_8_ + auVar55._0_8_) * dVar2;
        dVar102 = dVar102 * ((local_e20 * local_e20 + local_cb8 * local_cb8 + local_b50 * local_b50
                             + -1.0) * 0.5 +
                            (local_e20 * local_9e8 + local_cb8 * local_880 + local_b50 * local_718)
                            * dVar113);
        dVar118 = dVar118 * ((dStack_e18 * dStack_e18 + dStack_cb0 * dStack_cb0 +
                              dStack_b48 * dStack_b48 + -1.0) * 0.5 +
                            (dStack_e18 * dStack_9e0 + dStack_cb0 * dStack_878 +
                            dStack_b48 * dStack_710) * dVar115);
        dVar2 = dVar2 * (auVar56._0_8_ + auVar57._0_8_);
        auVar52 = *(undefined1 (*) [16])
                   (peVar3->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                   m_storage.m_data.array;
        auVar54 = *(undefined1 (*) [16])
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x10);
        auVar56 = *(undefined1 (*) [16])
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x20);
        auVar57 = *(undefined1 (*) [16])
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x30);
        dVar113 = *(double *)
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x40);
        local_16a0 = auVar52._0_8_;
        local_1680 = auVar54._0_8_;
        local_1660 = auVar56._0_8_;
        local_17e0 = auVar57._0_8_;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        auVar8 = vshufpd_avx(auVar52,auVar52,1);
        auVar52 = vshufpd_avx(auVar52,auVar52,3);
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = dVar108 * local_16a0 + dVar119 * auVar52._0_8_ + dVar102 * local_1680;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = dVar111 * local_16a0 + dVar120 * auVar52._8_8_ + dVar118 * local_1680;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = dVar6 * local_16a0 + dVar7 * auVar8._0_8_ + dVar2 * local_1680;
        auVar52 = vshufpd_avx(auVar54,auVar54,1);
        auVar8 = vshufpd_avx(auVar56,auVar56,1);
        auVar54 = vshufpd_avx(auVar54,auVar54,3);
        auVar56 = vshufpd_avx(auVar56,auVar56,3);
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x81] = dVar102 * auVar56._0_8_ + dVar108 * auVar54._0_8_ + dVar119 * local_1660;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x82] = dVar118 * auVar56._8_8_ + dVar111 * auVar54._8_8_ + dVar120 * local_1660;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = dVar2 * auVar8._0_8_ + dVar6 * auVar52._0_8_ + dVar7 * local_1660;
        auVar52 = vshufpd_avx(auVar57,auVar57,1);
        auVar54 = vshufpd_avx(auVar57,auVar57,3);
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = dVar108 * local_17e0 + dVar119 * auVar54._0_8_ + dVar102 * dVar113;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = dVar111 * local_17e0 + dVar120 * auVar54._8_8_ + dVar118 * dVar113;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = dVar2 * dVar113 + local_17e0 * dVar6 + dVar7 * auVar52._0_8_;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x24] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_e50;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x25] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_e48;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x26] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_e40;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x51] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_ce8;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x52] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_ce0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x53] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_cd8;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_b80;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_b78;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_b70;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x27] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x81] * local_e38;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x28] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x82] * dStack_e30;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x29] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_e28;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x54] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x81] * local_cd0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x55] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x82] * dStack_cc8;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x56] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_cc0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x81] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x81] * local_b68;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x82] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x82] * dStack_b60;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_b58;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2a] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_e20;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2b] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_e18;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2c] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_e10;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x57] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_cb8;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x58] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_cb0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x59] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_ca8;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_b50;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_b48;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_b40;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar51 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_0072413c;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 8) {
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_1608 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,8,3,1,8,3>>(&local_2c0,a_lhs,&local_6f8,&local_1608);
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x18) {
            pdVar49 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            if (pdVar49 != (double *)0x0) {
              free((void *)pdVar49[-1]);
            }
            pvVar47 = malloc(0x100);
            if (pvVar47 == (void *)0x0) {
              pdVar49 = (double *)0x0;
            }
            else {
              *(void **)(((ulong)pvVar47 & 0xffffffffffffffc0) + 0x38) = pvVar47;
              pdVar49 = (double *)(((ulong)pvVar47 & 0xffffffffffffffc0) + 0x40);
            }
            if (pdVar49 == (double *)0x0) {
              puVar48 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar48 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar48,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar49;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x18;
          }
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              == 0x18) {
            pdVar49 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            uVar50 = 0xfffffffffffffff8;
            do {
              dVar2 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar50 + 9];
              dVar102 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                        m_storage.m_data.array[uVar50 + 10];
              dVar118 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                        m_storage.m_data.array[uVar50 + 0xb];
              dVar113 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                        m_storage.m_data.array[uVar50 + 0xc];
              dVar115 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                        m_storage.m_data.array[uVar50 + 0xd];
              dVar6 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar50 + 0xe];
              dVar7 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                      m_storage.m_data.array[uVar50 + 0xf];
              pdVar1 = pdVar49 + uVar50 + 8;
              *pdVar1 = local_2c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                        m_storage.m_data.array[uVar50 + 8];
              pdVar1[1] = dVar2;
              pdVar1[2] = dVar102;
              pdVar1[3] = dVar118;
              pdVar1[4] = dVar113;
              pdVar1[5] = dVar115;
              pdVar1[6] = dVar6;
              pdVar1[7] = dVar7;
              uVar50 = uVar50 + 8;
            } while (uVar50 < 0x10);
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 24, 1>>, T1 = double, T2 = double]"
                       );
        }
        pcVar51 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 8, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 8, 3, 1>]"
        ;
        goto LAB_0072415e;
      }
      pcVar51 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar51 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar51);
  }
  pcVar51 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 6, 0>]"
  ;
LAB_0072415e:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar51);
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For this element, this is likely more efficient than the "Pre-Integration" style calculation method.  Note that
    // the integrand for the generalize internal force vector for a straight and normalized element is of order : 8 in
    // xi, 4 in eta, and 4 in zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and
    // zeta directions for "Full Integration". However, very similar results can be obtained with fewer GQ point in each
    // direction, resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff can be calculated by
    // simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding diagonal entry
    // in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Block entries will be calculated separately in a later step.
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // Note that with the material assumption being used, only [E11,E22,E33] need to be calculated
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 Block entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}